

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::ShaderRenderCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,ShaderRenderCaseInstance *this)

{
  uint width;
  uint uVar1;
  PtrData<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_> data;
  bool bVar2;
  QuadGrid *this_00;
  uint height;
  Surface refImage;
  Surface resImage;
  QuadGrid *pQVar3;
  undefined8 in_stack_ffffffffffffff60;
  allocator<char> local_91;
  PixelBufferAccess local_90;
  undefined1 local_68 [40];
  Surface local_40;
  
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  width = (this->m_renderSize).m_data[0];
  if (0x7f < width) {
    width = 0x80;
  }
  uVar1 = (this->m_renderSize).m_data[1];
  height = 0x80;
  if (uVar1 < 0x80) {
    height = uVar1;
  }
  this_00 = (QuadGrid *)operator_new(0x130);
  local_68._0_4_ = 0x3e000000;
  local_68._4_4_ = 0x3e800000;
  local_68._8_8_ = (void *)0x3f8000003f000000;
  pQVar3 = (QuadGrid *)&this->m_textures;
  QuadGrid::QuadGrid(this_00,this->m_quadGridSize,width,height,(Vec4 *)local_68,
                     &this->m_userAttribTransforms,
                     (vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
                      *)pQVar3);
  local_90.super_ConstPixelBufferAccess.m_format.order = R;
  local_90.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  data._8_8_ = in_stack_ffffffffffffff60;
  data.ptr = pQVar3;
  de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::assignData
            (&(this->m_quadGrid).
              super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>,data);
  de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::~UniqueBase
            ((UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_> *)&local_90);
  tcu::Surface::Surface(&local_40,width,height);
  pQVar3 = (this->m_quadGrid).
           super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>.m_data.ptr;
  render(this,pQVar3->m_numVertices,pQVar3->m_numTriangles,
         (pQVar3->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_start,&pQVar3->m_constCoords);
  tcu::Surface::getAccess(&local_90,&local_40);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_68,&this->m_resultImage);
  tcu::copy((EVP_PKEY_CTX *)&local_90,(EVP_PKEY_CTX *)local_68);
  tcu::Surface::Surface((Surface *)local_68,width,height);
  pQVar3 = (this->m_quadGrid).
           super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>.m_data.ptr;
  if (this->m_isVertexCase == true) {
    computeVertexReference(this,(Surface *)local_68,pQVar3);
  }
  else {
    computeFragmentReference(this,(Surface *)local_68,pQVar3);
  }
  bVar2 = compareImages(this,&local_40,(Surface *)local_68,0.2);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Result image matches reference",&local_91);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_90);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Image mismatch",&local_91);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  tcu::Surface::~Surface((Surface *)local_68);
  tcu::Surface::~Surface(&local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ShaderRenderCaseInstance::iterate (void)
{
	setup();

	// Create quad grid.
	const tcu::UVec2	viewportSize	= getViewportSize();
	const int			width			= viewportSize.x();
	const int			height			= viewportSize.y();

	m_quadGrid							= de::MovePtr<QuadGrid>(new QuadGrid(m_quadGridSize, width, height, getDefaultConstCoords(), m_userAttribTransforms, m_textures));

	// Render result.
	tcu::Surface		resImage		(width, height);

	render(m_quadGrid->getNumVertices(), m_quadGrid->getNumTriangles(), m_quadGrid->getIndices(), m_quadGrid->getConstCoords());
	tcu::copy(resImage.getAccess(), m_resultImage.getAccess());

	// Compute reference.
	tcu::Surface		refImage		(width, height);
	if (m_isVertexCase)
		computeVertexReference(refImage, *m_quadGrid);
	else
		computeFragmentReference(refImage, *m_quadGrid);

	// Compare.
	const bool			compareOk		= compareImages(resImage, refImage, 0.2f);

	if (compareOk)
		return tcu::TestStatus::pass("Result image matches reference");
	else
		return tcu::TestStatus::fail("Image mismatch");
}